

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumCheckerboardTexture *
pbrt::SpectrumCheckerboardTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  uintptr_t iptr;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar4;
  SpectrumCheckerboardTexture *pSVar5;
  undefined4 extraout_var_03;
  AAMethod AVar6;
  int dim;
  string ret;
  SpectrumTextureHandle tex2;
  SpectrumTextureHandle tex1;
  string aa;
  TextureMapping2DHandle map;
  int local_12c;
  string local_128;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  FileLoc *local_a0;
  undefined1 local_98 [16];
  string local_88;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_68;
  string local_60;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  paVar1 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"dimension","");
  local_12c = TextureParameterDictionary::GetOneInt(parameters,&local_128,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_12c - 4U < 0xfffffffe) {
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity =
         local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<int&>
              (&local_128,"%d dimensional checkerboard texture not supported",&local_12c);
    Error(loc,local_128._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    pSVar5 = (SpectrumCheckerboardTexture *)0x0;
  }
  else {
    local_a0 = loc;
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar2) = 0;
    iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var_00,iVar3) = 0x3f800000;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"tex1","");
    local_38 = CONCAT44(extraout_var_00,iVar3) | 0x1000000000000;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)(local_98 + 8),(string *)parameters,
               (SpectrumHandle *)&local_128,(SpectrumType)&local_38,(Allocator)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"tex2","");
    local_40 = CONCAT44(extraout_var,iVar2) | 0x1000000000000;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)local_98,(string *)parameters,
               (SpectrumHandle *)&local_128,(SpectrumType)&local_40,(Allocator)0x0);
    paVar1 = &local_128.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_12c == 2) {
      TextureMapping2DHandle::Create
                ((TextureMapping2DHandle *)&local_68,parameters->dict,renderFromTexture,local_a0,
                 alloc);
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"aamode","");
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"closedform","");
      TextureParameterDictionary::GetOneString(&local_88,parameters,&local_128,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar2 == 0) {
        AVar6 = None;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_88);
        AVar6 = ClosedForm;
        if (iVar2 != 0) {
          local_128._M_string_length = 0;
          local_128.field_2._M_allocated_capacity =
               local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_128._M_dataplus._M_p = (pointer)paVar1;
          detail::stringPrintfRecursive<std::__cxx11::string&>
                    (&local_128,
                     "Antialiasing mode \"%s\" not understood by Checkerboard2DTexture; using \"closedform\""
                     ,&local_88);
          Warning(local_a0,local_128._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
        }
      }
      iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
      pSVar5 = (SpectrumCheckerboardTexture *)CONCAT44(extraout_var_03,iVar2);
      (pSVar5->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = local_68.bits;
      (pSVar5->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits = 0;
      pSVar5->tex[0].
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = local_98._8_8_;
      pSVar5->tex[1].
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = local_98._0_8_;
      pSVar5->aaMethod = AVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_128._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
      local_128._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
      local_128.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
      local_128.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
      uStack_108 = *(undefined8 *)(renderFromTexture->mInv).m[2];
      uStack_100 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
      uStack_f8 = *(undefined8 *)(renderFromTexture->mInv).m[3];
      uStack_f0 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
      local_e8 = *(undefined8 *)(renderFromTexture->m).m[0];
      uStack_e0 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
      uStack_d8 = *(undefined8 *)(renderFromTexture->m).m[1];
      uStack_d0 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
      uStack_c8 = *(undefined8 *)(renderFromTexture->m).m[2];
      uStack_c0 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
      uStack_b8 = *(undefined8 *)(renderFromTexture->m).m[3];
      uStack_b0 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
      iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
      puVar4 = (undefined8 *)CONCAT44(extraout_var_01,iVar2);
      *puVar4 = local_128._M_dataplus._M_p;
      puVar4[1] = local_128._M_string_length;
      puVar4[2] = local_128.field_2._M_allocated_capacity;
      puVar4[3] = local_128.field_2._8_8_;
      puVar4[4] = uStack_108;
      puVar4[5] = uStack_100;
      puVar4[6] = uStack_f8;
      puVar4[7] = uStack_f0;
      puVar4[8] = local_e8;
      puVar4[9] = uStack_e0;
      puVar4[10] = uStack_d8;
      puVar4[0xb] = uStack_d0;
      puVar4[0xc] = uStack_c8;
      puVar4[0xd] = uStack_c0;
      puVar4[0xe] = uStack_b8;
      puVar4[0xf] = uStack_b0;
      iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
      pSVar5 = (SpectrumCheckerboardTexture *)CONCAT44(extraout_var_02,iVar2);
      (pSVar5->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = 0;
      (pSVar5->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits =
           (ulong)puVar4 | 0x1000000000000;
      pSVar5->tex[0].
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = local_98._8_8_;
      pSVar5->tex[1].
      super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = local_98._0_8_;
      pSVar5->aaMethod = None;
    }
  }
  return pSVar5;
}

Assistant:

SpectrumCheckerboardTexture *SpectrumCheckerboardTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    int dim = parameters.GetOneInt("dimension", 2);
    if (dim != 2 && dim != 3) {
        Error(loc, "%d dimensional checkerboard texture not supported", dim);
        return nullptr;
    }

    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    SpectrumTextureHandle tex1 =
        parameters.GetSpectrumTexture("tex1", one, SpectrumType::Reflectance, alloc);
    SpectrumTextureHandle tex2 =
        parameters.GetSpectrumTexture("tex2", zero, SpectrumType::Reflectance, alloc);
    if (dim == 2) {
        // Initialize 2D texture mapping _map_ from _tp_
        TextureMapping2DHandle map =
            TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

        // Compute _aaMethod_ for _CheckerboardTexture_
        std::string aa = parameters.GetOneString("aamode", "closedform");
        AAMethod aaMethod;
        if (aa == "none")
            aaMethod = AAMethod::None;
        else if (aa == "closedform")
            aaMethod = AAMethod::ClosedForm;
        else {
            Warning(loc,
                    "Antialiasing mode \"%s\" not understood by "
                    "Checkerboard2DTexture; using \"closedform\"",
                    aa);
            aaMethod = AAMethod::ClosedForm;
        }
        return alloc.new_object<SpectrumCheckerboardTexture>(map, nullptr, tex1, tex2,
                                                             aaMethod);
    } else {
        // Initialize 3D texture mapping _map_ from _tp_
        TextureMapping3DHandle map =
            TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
        return alloc.new_object<SpectrumCheckerboardTexture>(nullptr, map, tex1, tex2,
                                                             AAMethod::None);
    }
}